

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O2

void __thiscall Tree::createWeightArray(Tree *this)

{
  Node **ppNVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int currWeight;
  value_type_conflict local_24;
  
  iVar6 = 0;
  quickSort(this,0,this->m_queueIndexArraySize + -1);
  do {
    local_24 = 1;
    if (this->m_queueIndexArraySize <= iVar6) {
      return;
    }
    lVar4 = (long)this->m_queueIndexArraySize + -1;
    if (iVar6 != (int)lVar4) {
      ppNVar1 = this->m_queueIndexArray;
      uVar3 = (ulong)iVar6;
      if ((ppNVar1[uVar3]->field_1).data.year == (ppNVar1[uVar3 + 1]->field_1).data.year) {
        lVar2 = 0;
        do {
          lVar5 = lVar2;
          if (~uVar3 + lVar4 == lVar5) break;
          lVar2 = lVar5 + 1;
        } while ((ppNVar1[uVar3 + lVar5 + 1]->field_1).data.year ==
                 (ppNVar1[uVar3 + lVar5 + 2]->field_1).data.year);
        local_24 = (int)lVar5 + 2;
      }
    }
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_weightArray,&local_24);
    iVar6 = iVar6 + local_24;
  } while( true );
}

Assistant:

void createWeightArray() {
        quickSort(0, m_queueIndexArraySize - 1);
        int currWeight = 1;
        for (int i = 0; i < m_queueIndexArraySize; ++i) {
            if ((i != m_queueIndexArraySize - 1) && (m_queueIndexArray[i]->data.year == m_queueIndexArray[i + 1]->data.year)) {
                currWeight++;
                int j = i + 1;
                while ((j != m_queueIndexArraySize - 1) && (m_queueIndexArray[j]->data.year == m_queueIndexArray[j + 1]->data.year)) {
                    currWeight++;
                    j++;
                }
            }
            m_weightArray.push_back(currWeight);
            i += currWeight - 1;
            currWeight = 1;
        }
    }